

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

void Saig_ManDemiterLabel_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int Value)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t **ppAVar4;
  
  iVar2 = p->nTravIds;
  if (pObj->TravId != iVar2) {
    do {
      pObj->TravId = iVar2;
      uVar1 = *(ulong *)&pObj->field_0x18;
      *(ulong *)&pObj->field_0x18 = uVar1 | (ulong)(Value != 0) * 0x10 + 0x10;
      uVar3 = (uint)uVar1;
      if ((uVar3 & 7) == 2) {
        if ((pObj->field_0).CioId < p->nTruePis) {
          return;
        }
        uVar3 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
        if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppAVar4 = (Aig_Obj_t **)((long)p->vCos->pArray[uVar3] + 8);
      }
      else {
        if ((uVar3 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                        ,0x357,"void Saig_ManDemiterLabel_rec(Aig_Man_t *, Aig_Obj_t *, int)");
        }
        Saig_ManDemiterLabel_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),Value);
        ppAVar4 = &pObj->pFanin1;
      }
      pObj = (Aig_Obj_t *)((ulong)*ppAVar4 & 0xfffffffffffffffe);
      iVar2 = p->nTravIds;
    } while (pObj->TravId != iVar2);
  }
  return;
}

Assistant:

void Saig_ManDemiterLabel_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int Value )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Value ) 
        pObj->fMarkB = 1;
    else
        pObj->fMarkA = 1;
    if ( Saig_ObjIsPi(p, pObj) )
        return;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        Saig_ManDemiterLabel_rec( p, Aig_ObjFanin0( Saig_ObjLoToLi(p, pObj) ), Value );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManDemiterLabel_rec( p, Aig_ObjFanin0(pObj), Value );
    Saig_ManDemiterLabel_rec( p, Aig_ObjFanin1(pObj), Value );
}